

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

string * __thiscall MetaCommand::TypeToString_abi_cxx11_(MetaCommand *this,TypeEnumType type)

{
  undefined4 in_EDX;
  string *in_RDI;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  switch(in_EDX) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"float",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"not defined",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"string",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"list",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"flag",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"boolean",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return in_RDI;
}

Assistant:

METAIO_STL::string MetaCommand::TypeToString(TypeEnumType type)
{
  switch(type)
    {
    case INT:
      return "int";
    case FLOAT:
      return "float";
    case STRING:
      return "string";
    case LIST:
      return "list";
    case FLAG:
      return "flag";
    case BOOL:
      return "boolean";
    default:
      return "not defined";
    }
}